

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Command::Validate(Command *this,string *shortprefix,string *longprefix)

{
  Base *pBVar1;
  pointer ppBVar2;
  bool bVar3;
  uint uVar4;
  reference ppBVar5;
  ulong uVar6;
  string *problem_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Group *in_RDI;
  ostringstream problem;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  anon_class_1_0_00000001 onValidationError;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_fffffffffffffdf8;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  *in_stack_fffffffffffffe00;
  ostringstream *this_00;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  ostringstream local_1b8 [360];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb0;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_30;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = (*(in_RDI->super_Base)._vptr_Base[2])();
  if ((uVar4 & 1) != 0) {
    local_28 = Group::Children(in_RDI);
    local_30._M_current =
         (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                            (in_stack_fffffffffffffdf8);
    std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_fffffffffffffdf8);
    while (bVar3 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffe00,
                              (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                               *)in_stack_fffffffffffffdf8), bVar3) {
      ppBVar5 = __gnu_cxx::
                __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                ::operator*(&local_30);
      pBVar1 = *ppBVar5;
      uVar4 = (*pBVar1->_vptr_Base[6])();
      if (((uVar4 & 1) != 0) && (uVar4 = (*pBVar1->_vptr_Base[2])(), (uVar4 & 1) == 0)) {
        Validate::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffb0);
      }
      (*pBVar1->_vptr_Base[3])(pBVar1,local_10,local_18);
      __gnu_cxx::
      __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
      ::operator++(&local_30);
    }
    if (in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      ppBVar2 = in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      (*(code *)((*ppBVar2)->help)._M_string_length)(ppBVar2,local_10,local_18);
      uVar6 = (**(code **)&(*in_RDI[3].children.
                             super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
                             .super__Vector_impl_data._M_finish)->help)();
      if ((uVar6 & 1) == 0) {
        Validate::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffb0);
      }
    }
    if (((in_RDI[2].validator._M_invoker == (_Invoker_type)0x0) &&
        (((ulong)in_RDI[2].validator.super__Function_base._M_manager & 1) != 0)) &&
       ((bVar3 = Group::HasCommand((Group *)CONCAT17(in_stack_fffffffffffffe17,
                                                     in_stack_fffffffffffffe10)), bVar3 ||
        (((ulong)in_RDI[3].children.super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                 _M_impl.super__Vector_impl_data._M_start & 0x10000) != 0)))) {
      this_00 = local_1b8;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Command is required");
      problem_00 = (string *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      ValidationError::ValidationError((ValidationError *)this_00,problem_00);
      __cxa_throw(problem_00,&ValidationError::typeinfo,ValidationError::~ValidationError);
    }
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortprefix, const std::string &longprefix) const override
            {
                if (!Matched())
                {
                    return;
                }

                auto onValidationError = [&]
                {
                    std::ostringstream problem;
                    problem << "Group validation failed somewhere!";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                };

                for (Base *child: Children())
                {
                    if (child->IsGroup() && !child->Matched())
                    {
                        onValidationError();
                    }

                    child->Validate(shortprefix, longprefix);
                }

                if (subparser != nullptr)
                {
                    subparser->Validate(shortprefix, longprefix);
                    if (!subparser->Matched())
                    {
                        onValidationError();
                    }
                }

                if (selectedCommand == nullptr && commandIsRequired && (Group::HasCommand() || subparserHasCommand))
                {
                    std::ostringstream problem;
                    problem << "Command is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                }
            }